

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O0

list<CfgNode_*,_std::allocator<CfgNode_*>_> * __thiscall
CFG::nodes_abi_cxx11_(list<CfgNode_*,_std::allocator<CfgNode_*>_> *__return_storage_ptr__,CFG *this)

{
  const_iterator cVar1;
  const_iterator cVar2;
  back_insert_iterator<std::__cxx11::list<CfgNode_*,_std::allocator<CfgNode_*>_>_> bVar3;
  CFG *this_local;
  list<CfgNode_*,_std::allocator<CfgNode_*>_> *nodes;
  
  std::__cxx11::list<CfgNode_*,_std::allocator<CfgNode_*>_>::list(__return_storage_ptr__);
  std::__cxx11::list<CfgNode_*,_std::allocator<CfgNode_*>_>::push_back
            (__return_storage_ptr__,&this->m_entryNode);
  if (this->m_exitNode != (CfgNode *)0x0) {
    std::__cxx11::list<CfgNode_*,_std::allocator<CfgNode_*>_>::push_back
              (__return_storage_ptr__,&this->m_exitNode);
  }
  if (this->m_haltNode != (CfgNode *)0x0) {
    std::__cxx11::list<CfgNode_*,_std::allocator<CfgNode_*>_>::push_back
              (__return_storage_ptr__,&this->m_haltNode);
  }
  cVar1 = std::
          map<unsigned_long,_CfgNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CfgNode_*>_>_>
          ::begin(&this->m_nodesMap);
  cVar2 = std::
          map<unsigned_long,_CfgNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CfgNode_*>_>_>
          ::end(&this->m_nodesMap);
  bVar3 = std::back_inserter<std::__cxx11::list<CfgNode*,std::allocator<CfgNode*>>>
                    (__return_storage_ptr__);
  std::
  transform<std::_Rb_tree_const_iterator<std::pair<unsigned_long_const,CfgNode*>>,std::back_insert_iterator<std::__cxx11::list<CfgNode*,std::allocator<CfgNode*>>>,CFG::nodes()const::__0>
            (cVar1._M_node,cVar2._M_node,bVar3.container);
  return __return_storage_ptr__;
}

Assistant:

std::list<CfgNode*> CFG::nodes() const {
	std::list<CfgNode*> nodes;

	nodes.push_back(m_entryNode);

	if (m_exitNode)
		nodes.push_back(m_exitNode);

	if (m_haltNode)
		nodes.push_back(m_haltNode);

	std::transform(m_nodesMap.begin(), m_nodesMap.end(),
	    std::back_inserter(nodes),
	    [](const std::map<Addr, CfgNode*>::value_type &pair) {
			return pair.second;
		}
	);

	return nodes;
}